

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

Gia_Man_t * Gia_ManDeriveDup(Gia_Man_t *p,int nPisNew)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar3;
  
  p_00 = Gia_ManDup(p);
  if (0 < nPisNew) {
    do {
      pGVar3 = Gia_ManAppendObj(p_00);
      uVar1 = *(ulong *)pGVar3;
      *(ulong *)pGVar3 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar3 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar3 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar3)) {
LAB_00597f85:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar3 - (long)pGVar2) >> 2) * -0x55555555);
      if ((pGVar3 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar3)) goto LAB_00597f85;
      nPisNew = nPisNew + -1;
    } while (nPisNew != 0);
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDeriveDup( Gia_Man_t * p, int nPisNew )
{
    int i;
    Gia_Man_t * pNew = Gia_ManDup(p);
    for ( i = 0; i < nPisNew; i++ )
        Gia_ManAppendCi( pNew );
    return pNew;
}